

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

bool cmCTestScriptHandler::EmptyBinaryDirectory(string *sname)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string check;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  
  if (sname->_M_string_length < 2) {
    bVar3 = false;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(sname);
    bVar3 = true;
    if (bVar1) {
      local_38._M_str = (sname->_M_dataplus)._M_p;
      local_38._M_len = sname->_M_string_length;
      local_28 = 0xf;
      local_20 = "/CMakeCache.txt";
      views._M_len = 2;
      views._M_array = &local_38;
      cmCatViews_abi_cxx11_(&local_58,views);
      bVar1 = cmsys::SystemTools::FileExists(&local_58);
      if (bVar1) {
        uVar2 = 0xffffffff;
        do {
          bVar1 = TryToRemoveBinaryDirectoryOnce(sname);
          if (bVar1) {
            bVar3 = true;
            break;
          }
          cmsys::SystemTools::Delay(100);
          uVar2 = uVar2 + 1;
          bVar3 = uVar2 < 4;
        } while (uVar2 != 4);
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmCTestScriptHandler::EmptyBinaryDirectory(const std::string& sname)
{
  // try to avoid deleting root
  if (sname.size() < 2) {
    return false;
  }

  // consider non existing target directory a success
  if (!cmSystemTools::FileExists(sname)) {
    return true;
  }

  // try to avoid deleting directories that we shouldn't
  std::string check = cmStrCat(sname, "/CMakeCache.txt");

  if (!cmSystemTools::FileExists(check)) {
    return false;
  }

  for (int i = 0; i < 5; ++i) {
    if (TryToRemoveBinaryDirectoryOnce(sname)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }

  return false;
}